

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O2

void __thiscall
llvm::RangeListEntry::dump
          (RangeListEntry *this,raw_ostream *OS,uint8_t AddrSize,uint8_t MaxEncodingStringLength,
          uint64_t *CurrentBase,DIDumpOptions DumpOpts,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
          LookupPooledAddress)

{
  uint64_t uVar1;
  SectionedAddress *pSVar2;
  char *Str;
  undefined1 auVar3 [16];
  StringRef SVar4;
  undefined1 auStack_68 [8];
  Optional<llvm::object::SectionedAddress> SA;
  
  if (DumpOpts.Verbose == true) {
    SA.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3ae4ede;
    auStack_68 = (undefined1  [8])&PTR_home_01127cf0;
    SA.Storage.field_0.value.SectionIndex = (this->super_DWARFListEntryBase).Offset;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_68);
    SVar4 = dwarf::RangeListEncodingString((uint)(this->super_DWARFListEntryBase).EntryKind);
    if (SVar4.Length == 0) {
      __assert_fail("!EncodingString.empty() && \"Unknown range entry encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                    ,0xc1,
                    "void llvm::RangeListEntry::dump(raw_ostream &, uint8_t, uint8_t, uint64_t &, DIDumpOptions, llvm::function_ref<Optional<object::SectionedAddress> (uint32_t)>) const"
                   );
    }
    SA.Storage._16_8_ = ((ulong)MaxEncodingStringLength - SVar4.Length) + 1;
    SA.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3ae4f33;
    auStack_68 = (undefined1  [8])&PTR_home_01128398;
    SA.Storage.field_0.value.SectionIndex._0_1_ = 0x5d;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_68);
    if ((this->super_DWARFListEntryBase).EntryKind != '\0') {
      raw_ostream::operator<<(OS,": ");
    }
  }
  switch((this->super_DWARFListEntryBase).EntryKind) {
  case '\0':
    Str = "<End of list>";
    if (DumpOpts.Verbose != false) {
      Str = "";
    }
    raw_ostream::operator<<(OS,Str);
    goto LAB_00d9506b;
  case '\x01':
    (*LookupPooledAddress.callback)
              ((Optional<llvm::object::SectionedAddress> *)auStack_68,LookupPooledAddress.callable,
               (uint)this->Value0);
    pSVar2 = (SectionedAddress *)&this->Value0;
    if (SA.Storage.field_0.value.SectionIndex._0_1_ == '\x01') {
      pSVar2 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                         ((OptionalStorage<llvm::object::SectionedAddress,_true> *)auStack_68);
    }
    *CurrentBase = pSVar2->Address;
    if (DumpOpts.Verbose == false) {
      return;
    }
    SA.Storage.field_0.value.SectionIndex = this->Value0;
    SA.Storage._20_4_ = (uint)AddrSize * 2;
    SA.Storage._16_4_ = (uint)AddrSize * 2;
    goto LAB_00d94f0e;
  default:
    llvm_unreachable_internal
              ("Unsupported range list encoding",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
               ,0xf2);
  case '\x03':
    dump::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)OS,(raw_ostream *)this,(RangeListEntry *)(ulong)AddrSize,
               '(',DumpOpts);
    (*LookupPooledAddress.callback)
              ((Optional<llvm::object::SectionedAddress> *)auStack_68,LookupPooledAddress.callable,
               (uint)this->Value0);
    if (SA.Storage.field_0.value.SectionIndex._0_1_ == '\x01') {
      pSVar2 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                         ((OptionalStorage<llvm::object::SectionedAddress,_true> *)auStack_68);
      auStack_68 = (undefined1  [8])pSVar2->Address;
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
    }
    SA.Storage.field_0.value.Address = this->Value1 + (long)auStack_68;
    break;
  case '\x04':
    dump::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)OS,(raw_ostream *)this,(RangeListEntry *)(ulong)AddrSize,
               '(',DumpOpts);
    uVar1 = *CurrentBase;
    auVar3._8_4_ = (int)uVar1;
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = (int)(uVar1 >> 0x20);
    auStack_68 = (undefined1  [8])(uVar1 + this->Value0);
    SA.Storage.field_0.value.Address = auVar3._8_8_ + this->Value1;
    break;
  case '\x05':
    SA.Storage.field_0.value.SectionIndex = this->Value0;
    *CurrentBase = SA.Storage.field_0.value.SectionIndex;
    if (DumpOpts.Verbose == false) {
      return;
    }
    SA.Storage._20_4_ = (uint)AddrSize * 2;
    SA.Storage._16_4_ = (uint)AddrSize * 2;
LAB_00d94f0e:
    SA.Storage.field_0.value.Address = (long)"0x%*.*lx, 0x%*.*lx" + 9;
    auStack_68 = (undefined1  [8])&PTR_home_011283d8;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_68);
    goto LAB_00d9506b;
  case '\x06':
    auStack_68 = (undefined1  [8])this->Value0;
    SA.Storage.field_0.value.Address = this->Value1;
    break;
  case '\a':
    dump::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)OS,(raw_ostream *)this,(RangeListEntry *)(ulong)AddrSize,
               '(',DumpOpts);
    auStack_68 = (undefined1  [8])this->Value0;
    SA.Storage.field_0.value.Address = this->Value1 + (long)auStack_68;
  }
  SA.Storage.field_0.value.SectionIndex = 0;
  DWARFAddressRange::dump((DWARFAddressRange *)auStack_68,OS,(uint)AddrSize,DumpOpts);
LAB_00d9506b:
  raw_ostream::operator<<(OS,"\n");
  return;
}

Assistant:

void RangeListEntry::dump(
    raw_ostream &OS, uint8_t AddrSize, uint8_t MaxEncodingStringLength,
    uint64_t &CurrentBase, DIDumpOptions DumpOpts,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress) const {
  auto PrintRawEntry = [](raw_ostream &OS, const RangeListEntry &Entry,
                          uint8_t AddrSize, DIDumpOptions DumpOpts) {
    if (DumpOpts.Verbose) {
      DumpOpts.DisplayRawContents = true;
      DWARFAddressRange(Entry.Value0, Entry.Value1)
          .dump(OS, AddrSize, DumpOpts);
      OS << " => ";
    }
  };

  if (DumpOpts.Verbose) {
    // Print the section offset in verbose mode.
    OS << format("0x%8.8" PRIx64 ":", Offset);
    auto EncodingString = dwarf::RangeListEncodingString(EntryKind);
    // Unsupported encodings should have been reported during parsing.
    assert(!EncodingString.empty() && "Unknown range entry encoding");
    OS << format(" [%s%*c", EncodingString.data(),
                 MaxEncodingStringLength - EncodingString.size() + 1, ']');
    if (EntryKind != dwarf::DW_RLE_end_of_list)
      OS << ": ";
  }

  switch (EntryKind) {
  case dwarf::DW_RLE_end_of_list:
    OS << (DumpOpts.Verbose ? "" : "<End of list>");
    break;
  case dwarf::DW_RLE_base_addressx: {
    if (auto SA = LookupPooledAddress(Value0))
      CurrentBase = SA->Address;
    else
      CurrentBase = Value0;
    if (!DumpOpts.Verbose)
      return;
    OS << format(" 0x%*.*" PRIx64, AddrSize * 2, AddrSize * 2, Value0);
    break;
  }
  case dwarf::DW_RLE_base_address:
    // In non-verbose mode we do not print anything for this entry.
    CurrentBase = Value0;
    if (!DumpOpts.Verbose)
      return;
    OS << format(" 0x%*.*" PRIx64, AddrSize * 2, AddrSize * 2, Value0);
    break;
  case dwarf::DW_RLE_start_length:
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    DWARFAddressRange(Value0, Value0 + Value1).dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_offset_pair:
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    DWARFAddressRange(Value0 + CurrentBase, Value1 + CurrentBase)
        .dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_start_end:
    DWARFAddressRange(Value0, Value1).dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_startx_length: {
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    uint64_t Start = 0;
    if (auto SA = LookupPooledAddress(Value0))
      Start = SA->Address;
    DWARFAddressRange(Start, Start + Value1).dump(OS, AddrSize, DumpOpts);
    break;
  }
  default:
    llvm_unreachable("Unsupported range list encoding");
  }
  OS << "\n";
}